

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

void __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::entered4(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxId param_1,int n)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  pointer pnVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint *puVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  ulong uVar12;
  byte bVar13;
  cpp_dec_float<200U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_1d8;
  cpp_dec_float<200U,_int,_void> local_158;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d0;
  pointer local_c8;
  pointer local_c0;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar13 = 0;
  if ((-1 < n) &&
     (pSVar1 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver, n < (pSVar1->thecovectors->set).thenum)) {
    pUVar2 = pSVar1->theCoPvec;
    pUVar3 = pSVar1->thePvec;
    local_c8 = (pUVar3->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_c0 = (pUVar2->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pnVar4 = (pSVar1->theFvec->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (uint *)(pnVar4 + (uint)n);
    pcVar9 = &local_158;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pcVar9->data)._M_elems[0] = *puVar8;
      puVar8 = puVar8 + 1;
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((pcVar9->data)._M_elems + 1);
    }
    local_158.exp = pnVar4[(uint)n].m_backend.exp;
    local_158.neg = pnVar4[(uint)n].m_backend.neg;
    local_158.fpclass = pnVar4[(uint)n].m_backend.fpclass;
    local_158.prec_elem = pnVar4[(uint)n].m_backend.prec_elem;
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 0x1c;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems[6] = 0;
    local_b8.data._M_elems[7] = 0;
    local_b8.data._M_elems[8] = 0;
    local_b8.data._M_elems[9] = 0;
    local_b8.data._M_elems[10] = 0;
    local_b8.data._M_elems[0xb] = 0;
    local_b8.data._M_elems[0xc] = 0;
    local_b8.data._M_elems[0xd] = 0;
    local_b8.data._M_elems[0xe] = 0;
    local_b8.data._M_elems[0xf] = 0;
    local_b8.data._M_elems[0x10] = 0;
    local_b8.data._M_elems[0x11] = 0;
    local_b8.data._M_elems[0x12] = 0;
    local_b8.data._M_elems[0x13] = 0;
    local_b8.data._M_elems[0x14] = 0;
    local_b8.data._M_elems[0x15] = 0;
    local_b8.data._M_elems[0x16] = 0;
    local_b8.data._M_elems[0x17] = 0;
    local_b8.data._M_elems[0x18] = 0;
    local_b8.data._M_elems[0x19] = 0;
    local_b8.data._M_elems._104_5_ = 0;
    local_b8.data._M_elems[0x1b]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_1d8,1,(type *)0x0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_b8,&local_1d8,&local_158);
    pcVar9 = &local_b8;
    pcVar10 = &local_158;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pcVar10->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar13 * -8 + 4);
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar13 * -8 + 4);
    }
    local_158.exp = local_b8.exp;
    local_158.neg = local_b8.neg;
    local_158.fpclass = local_b8.fpclass;
    local_158.prec_elem = local_b8.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&local_158,&local_b8);
    local_d0 = this;
    local_1d8.fpclass = cpp_dec_float_finite;
    local_1d8.prec_elem = 0x1c;
    local_1d8.data._M_elems[0] = 0;
    local_1d8.data._M_elems[1] = 0;
    local_1d8.data._M_elems[2] = 0;
    local_1d8.data._M_elems[3] = 0;
    local_1d8.data._M_elems[4] = 0;
    local_1d8.data._M_elems[5] = 0;
    local_1d8.data._M_elems[6] = 0;
    local_1d8.data._M_elems[7] = 0;
    local_1d8.data._M_elems[8] = 0;
    local_1d8.data._M_elems[9] = 0;
    local_1d8.data._M_elems[10] = 0;
    local_1d8.data._M_elems[0xb] = 0;
    local_1d8.data._M_elems[0xc] = 0;
    local_1d8.data._M_elems[0xd] = 0;
    local_1d8.data._M_elems[0xe] = 0;
    local_1d8.data._M_elems[0xf] = 0;
    local_1d8.data._M_elems[0x10] = 0;
    local_1d8.data._M_elems[0x11] = 0;
    local_1d8.data._M_elems[0x12] = 0;
    local_1d8.data._M_elems[0x13] = 0;
    local_1d8.data._M_elems[0x14] = 0;
    local_1d8.data._M_elems[0x15] = 0;
    local_1d8.data._M_elems[0x16] = 0;
    local_1d8.data._M_elems[0x17] = 0;
    local_1d8.data._M_elems[0x18] = 0;
    local_1d8.data._M_elems[0x19] = 0;
    local_1d8.data._M_elems._104_5_ = 0;
    local_1d8.data._M_elems[0x1b]._1_3_ = 0;
    local_1d8.exp = 0;
    local_1d8.neg = false;
    pcVar9 = &local_158;
    if (&local_1d8 != &(this->last).m_backend) {
      pcVar9 = &local_158;
      pcVar10 = &local_1d8;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar10->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar13 * -8 + 4);
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar13 * -8 + 4);
      }
      local_1d8.exp = local_158.exp;
      local_1d8.neg = local_158.neg;
      local_1d8.fpclass = local_158.fpclass;
      local_1d8.prec_elem = local_158.prec_elem;
      pcVar9 = &(this->last).m_backend;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_1d8,pcVar9);
    pcVar9 = &local_1d8;
    pcVar10 = &local_b8;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pcVar10->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar13 * -8 + 4);
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar13 * -8 + 4);
    }
    local_b8.exp = local_1d8.exp;
    local_b8.neg = local_1d8.neg;
    local_b8.fpclass = local_1d8.fpclass;
    local_b8.prec_elem = local_1d8.prec_elem;
    lVar7 = (long)(pUVar2->thedelta).super_IdxSet.num;
    if (0 < lVar7) {
      uVar12 = lVar7 + 1;
      do {
        iVar6 = (pUVar2->thedelta).super_IdxSet.idx[uVar12 - 2];
        pcVar9 = &local_c0[iVar6].m_backend;
        local_158.fpclass = cpp_dec_float_finite;
        local_158.prec_elem = 0x1c;
        local_158.data._M_elems[0] = 0;
        local_158.data._M_elems[1] = 0;
        local_158.data._M_elems[2] = 0;
        local_158.data._M_elems[3] = 0;
        local_158.data._M_elems[4] = 0;
        local_158.data._M_elems[5] = 0;
        local_158.data._M_elems[6] = 0;
        local_158.data._M_elems[7] = 0;
        local_158.data._M_elems[8] = 0;
        local_158.data._M_elems[9] = 0;
        local_158.data._M_elems[10] = 0;
        local_158.data._M_elems[0xb] = 0;
        local_158.data._M_elems[0xc] = 0;
        local_158.data._M_elems[0xd] = 0;
        local_158.data._M_elems[0xe] = 0;
        local_158.data._M_elems[0xf] = 0;
        local_158.data._M_elems[0x10] = 0;
        local_158.data._M_elems[0x11] = 0;
        local_158.data._M_elems[0x12] = 0;
        local_158.data._M_elems[0x13] = 0;
        local_158.data._M_elems[0x14] = 0;
        local_158.data._M_elems[0x15] = 0;
        local_158.data._M_elems[0x16] = 0;
        local_158.data._M_elems[0x17] = 0;
        local_158.data._M_elems[0x18] = 0;
        local_158.data._M_elems[0x19] = 0;
        local_158.data._M_elems._104_5_ = 0;
        local_158.data._M_elems[0x1b]._1_3_ = 0;
        local_158.exp = 0;
        local_158.neg = false;
        pcVar10 = &local_b8;
        if (&local_158 != pcVar9) {
          pcVar11 = &local_158;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar11->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar13 * -8 + 4);
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar13 * -8 + 4);
          }
          local_158.exp = local_b8.exp;
          local_158.neg = local_b8.neg;
          local_158.fpclass = local_b8.fpclass;
          local_158.prec_elem = local_b8.prec_elem;
          pcVar10 = pcVar9;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_158,pcVar10);
        local_1d8.fpclass = cpp_dec_float_finite;
        local_1d8.prec_elem = 0x1c;
        local_1d8.data._M_elems[0] = 0;
        local_1d8.data._M_elems[1] = 0;
        local_1d8.data._M_elems[2] = 0;
        local_1d8.data._M_elems[3] = 0;
        local_1d8.data._M_elems[4] = 0;
        local_1d8.data._M_elems[5] = 0;
        local_1d8.data._M_elems[6] = 0;
        local_1d8.data._M_elems[7] = 0;
        local_1d8.data._M_elems[8] = 0;
        local_1d8.data._M_elems[9] = 0;
        local_1d8.data._M_elems[10] = 0;
        local_1d8.data._M_elems[0xb] = 0;
        local_1d8.data._M_elems[0xc] = 0;
        local_1d8.data._M_elems[0xd] = 0;
        local_1d8.data._M_elems[0xe] = 0;
        local_1d8.data._M_elems[0xf] = 0;
        local_1d8.data._M_elems[0x10] = 0;
        local_1d8.data._M_elems[0x11] = 0;
        local_1d8.data._M_elems[0x12] = 0;
        local_1d8.data._M_elems[0x13] = 0;
        local_1d8.data._M_elems[0x14] = 0;
        local_1d8.data._M_elems[0x15] = 0;
        local_1d8.data._M_elems[0x16] = 0;
        local_1d8.data._M_elems[0x17] = 0;
        local_1d8.data._M_elems[0x18] = 0;
        local_1d8.data._M_elems[0x19] = 0;
        local_1d8.data._M_elems._104_5_ = 0;
        local_1d8.data._M_elems[0x1b]._1_3_ = 0;
        local_1d8.exp = 0;
        local_1d8.neg = false;
        pcVar10 = &local_158;
        if (&local_1d8 != pcVar9) {
          pcVar11 = &local_1d8;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar11->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar13 * -8 + 4);
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar13 * -8 + 4);
          }
          local_1d8.exp = local_158.exp;
          local_1d8.neg = local_158.neg;
          local_1d8.fpclass = local_158.fpclass;
          local_1d8.prec_elem = local_158.prec_elem;
          pcVar10 = pcVar9;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_1d8,pcVar10);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&(pSVar1->coWeights).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend,&local_1d8);
        pnVar4 = (pSVar1->coWeights).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pnVar4[iVar6].m_backend.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_1d8,1,(type *)0x0);
          iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&pnVar4[iVar6].m_backend,&local_1d8);
          if (iVar5 < 1) goto LAB_0059ce6d;
          pnVar4 = (pSVar1->coWeights).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pnVar4[iVar6].m_backend.fpclass != cpp_dec_float_NaN) {
            local_1d8.fpclass = cpp_dec_float_finite;
            local_1d8.prec_elem = 0x1c;
            local_1d8.data._M_elems[0] = 0;
            local_1d8.data._M_elems[1] = 0;
            local_1d8.data._M_elems[2] = 0;
            local_1d8.data._M_elems[3] = 0;
            local_1d8.data._M_elems[4] = 0;
            local_1d8.data._M_elems[5] = 0;
            local_1d8.data._M_elems[6] = 0;
            local_1d8.data._M_elems[7] = 0;
            local_1d8.data._M_elems[8] = 0;
            local_1d8.data._M_elems[9] = 0;
            local_1d8.data._M_elems[10] = 0;
            local_1d8.data._M_elems[0xb] = 0;
            local_1d8.data._M_elems[0xc] = 0;
            local_1d8.data._M_elems[0xd] = 0;
            local_1d8.data._M_elems[0xe] = 0;
            local_1d8.data._M_elems[0xf] = 0;
            local_1d8.data._M_elems[0x10] = 0;
            local_1d8.data._M_elems[0x11] = 0;
            local_1d8.data._M_elems[0x12] = 0;
            local_1d8.data._M_elems[0x13] = 0;
            local_1d8.data._M_elems[0x14] = 0;
            local_1d8.data._M_elems[0x15] = 0;
            local_1d8.data._M_elems[0x16] = 0;
            local_1d8.data._M_elems[0x17] = 0;
            local_1d8.data._M_elems[0x18] = 0;
            local_1d8.data._M_elems[0x19] = 0;
            local_1d8.data._M_elems._104_5_ = 0;
            local_1d8.data._M_elems[0x1b]._1_3_ = 0;
            local_1d8.exp = 0;
            local_1d8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_1d8,1000000.0);
            iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&pnVar4[iVar6].m_backend,&local_1d8);
            if (0 < iVar6) goto LAB_0059ce6d;
          }
        }
        uVar12 = uVar12 - 1;
      } while (1 < uVar12);
    }
    lVar7 = (long)(pUVar3->thedelta).super_IdxSet.num;
    if (0 < lVar7) {
      uVar12 = lVar7 + 1;
      do {
        iVar6 = (pUVar3->thedelta).super_IdxSet.idx[uVar12 - 2];
        pcVar9 = &local_c8[iVar6].m_backend;
        local_158.fpclass = cpp_dec_float_finite;
        local_158.prec_elem = 0x1c;
        local_158.data._M_elems[0] = 0;
        local_158.data._M_elems[1] = 0;
        local_158.data._M_elems[2] = 0;
        local_158.data._M_elems[3] = 0;
        local_158.data._M_elems[4] = 0;
        local_158.data._M_elems[5] = 0;
        local_158.data._M_elems[6] = 0;
        local_158.data._M_elems[7] = 0;
        local_158.data._M_elems[8] = 0;
        local_158.data._M_elems[9] = 0;
        local_158.data._M_elems[10] = 0;
        local_158.data._M_elems[0xb] = 0;
        local_158.data._M_elems[0xc] = 0;
        local_158.data._M_elems[0xd] = 0;
        local_158.data._M_elems[0xe] = 0;
        local_158.data._M_elems[0xf] = 0;
        local_158.data._M_elems[0x10] = 0;
        local_158.data._M_elems[0x11] = 0;
        local_158.data._M_elems[0x12] = 0;
        local_158.data._M_elems[0x13] = 0;
        local_158.data._M_elems[0x14] = 0;
        local_158.data._M_elems[0x15] = 0;
        local_158.data._M_elems[0x16] = 0;
        local_158.data._M_elems[0x17] = 0;
        local_158.data._M_elems[0x18] = 0;
        local_158.data._M_elems[0x19] = 0;
        local_158.data._M_elems._104_5_ = 0;
        local_158.data._M_elems[0x1b]._1_3_ = 0;
        local_158.exp = 0;
        local_158.neg = false;
        pcVar10 = &local_b8;
        if (&local_158 != pcVar9) {
          pcVar11 = &local_158;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar11->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar13 * -8 + 4);
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar13 * -8 + 4);
          }
          local_158.exp = local_b8.exp;
          local_158.neg = local_b8.neg;
          local_158.fpclass = local_b8.fpclass;
          local_158.prec_elem = local_b8.prec_elem;
          pcVar10 = pcVar9;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_158,pcVar10);
        local_1d8.fpclass = cpp_dec_float_finite;
        local_1d8.prec_elem = 0x1c;
        local_1d8.data._M_elems[0] = 0;
        local_1d8.data._M_elems[1] = 0;
        local_1d8.data._M_elems[2] = 0;
        local_1d8.data._M_elems[3] = 0;
        local_1d8.data._M_elems[4] = 0;
        local_1d8.data._M_elems[5] = 0;
        local_1d8.data._M_elems[6] = 0;
        local_1d8.data._M_elems[7] = 0;
        local_1d8.data._M_elems[8] = 0;
        local_1d8.data._M_elems[9] = 0;
        local_1d8.data._M_elems[10] = 0;
        local_1d8.data._M_elems[0xb] = 0;
        local_1d8.data._M_elems[0xc] = 0;
        local_1d8.data._M_elems[0xd] = 0;
        local_1d8.data._M_elems[0xe] = 0;
        local_1d8.data._M_elems[0xf] = 0;
        local_1d8.data._M_elems[0x10] = 0;
        local_1d8.data._M_elems[0x11] = 0;
        local_1d8.data._M_elems[0x12] = 0;
        local_1d8.data._M_elems[0x13] = 0;
        local_1d8.data._M_elems[0x14] = 0;
        local_1d8.data._M_elems[0x15] = 0;
        local_1d8.data._M_elems[0x16] = 0;
        local_1d8.data._M_elems[0x17] = 0;
        local_1d8.data._M_elems[0x18] = 0;
        local_1d8.data._M_elems[0x19] = 0;
        local_1d8.data._M_elems._104_5_ = 0;
        local_1d8.data._M_elems[0x1b]._1_3_ = 0;
        local_1d8.exp = 0;
        local_1d8.neg = false;
        pcVar10 = &local_158;
        if (&local_1d8 != pcVar9) {
          pcVar11 = &local_1d8;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar11->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar13 * -8 + 4);
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar13 * -8 + 4);
          }
          local_1d8.exp = local_158.exp;
          local_1d8.neg = local_158.neg;
          local_1d8.fpclass = local_158.fpclass;
          local_1d8.prec_elem = local_158.prec_elem;
          pcVar10 = pcVar9;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_1d8,pcVar10);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&(pSVar1->weights).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar6].m_backend,&local_1d8);
        pnVar4 = (pSVar1->weights).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pnVar4[iVar6].m_backend.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_1d8,1,(type *)0x0);
          iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&pnVar4[iVar6].m_backend,&local_1d8);
          if (iVar5 < 1) {
LAB_0059ce6d:
            setupWeights(local_d0,ENTER);
            return;
          }
          pnVar4 = (pSVar1->weights).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pnVar4[iVar6].m_backend.fpclass != cpp_dec_float_NaN) {
            local_1d8.fpclass = cpp_dec_float_finite;
            local_1d8.prec_elem = 0x1c;
            local_1d8.data._M_elems[0] = 0;
            local_1d8.data._M_elems[1] = 0;
            local_1d8.data._M_elems[2] = 0;
            local_1d8.data._M_elems[3] = 0;
            local_1d8.data._M_elems[4] = 0;
            local_1d8.data._M_elems[5] = 0;
            local_1d8.data._M_elems[6] = 0;
            local_1d8.data._M_elems[7] = 0;
            local_1d8.data._M_elems[8] = 0;
            local_1d8.data._M_elems[9] = 0;
            local_1d8.data._M_elems[10] = 0;
            local_1d8.data._M_elems[0xb] = 0;
            local_1d8.data._M_elems[0xc] = 0;
            local_1d8.data._M_elems[0xd] = 0;
            local_1d8.data._M_elems[0xe] = 0;
            local_1d8.data._M_elems[0xf] = 0;
            local_1d8.data._M_elems[0x10] = 0;
            local_1d8.data._M_elems[0x11] = 0;
            local_1d8.data._M_elems[0x12] = 0;
            local_1d8.data._M_elems[0x13] = 0;
            local_1d8.data._M_elems[0x14] = 0;
            local_1d8.data._M_elems[0x15] = 0;
            local_1d8.data._M_elems[0x16] = 0;
            local_1d8.data._M_elems[0x17] = 0;
            local_1d8.data._M_elems[0x18] = 0;
            local_1d8.data._M_elems[0x19] = 0;
            local_1d8.data._M_elems._104_5_ = 0;
            local_1d8.data._M_elems[0x1b]._1_3_ = 0;
            local_1d8.exp = 0;
            local_1d8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_1d8,1000000.0);
            iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&pnVar4[iVar6].m_backend,&local_1d8);
            if (0 < iVar6) goto LAB_0059ce6d;
          }
        }
        uVar12 = uVar12 - 1;
      } while (1 < uVar12);
    }
  }
  return;
}

Assistant:

void SPxDevexPR<R>::entered4(SPxId /*id*/, int n)
{
   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(n >= 0 && n < this->thesolver->dim())
   {
      const R* pVec = this->thesolver->pVec().delta().values();
      const IdxSet& pIdx = this->thesolver->pVec().idx();
      const R* coPvec = this->thesolver->coPvec().delta().values();
      const IdxSet& coPidx = this->thesolver->coPvec().idx();
      R xi_p = 1 / this->thesolver->fVec().delta()[n];
      int i, j;

      assert(this->thesolver->fVec().delta()[n] > this->thesolver->epsilon()
             || this->thesolver->fVec().delta()[n] < -this->thesolver->epsilon());

      xi_p = xi_p * xi_p * last;

      for(j = coPidx.size() - 1; j >= 0; --j)
      {
         i = coPidx.index(j);
         coWeights[i] += xi_p * coPvec[i] * coPvec[i];

         if(coWeights[i] <= 1 || coWeights[i] > 1e+6)
         {
            setupWeights(SPxSolverBase<R>::ENTER);
            return;
         }
      }

      for(j = pIdx.size() - 1; j >= 0; --j)
      {
         i = pIdx.index(j);
         weights[i] += xi_p * pVec[i] * pVec[i];

         if(weights[i] <= 1 || weights[i] > 1e+6)
         {
            setupWeights(SPxSolverBase<R>::ENTER);
            return;
         }
      }
   }
}